

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O0

void cmCMakePresetsErrors::INVALID_PRESET_NAMED(string *presetName,cmJSONState *state)

{
  string local_38;
  cmJSONState *local_18;
  cmJSONState *state_local;
  string *presetName_local;
  
  local_18 = state;
  state_local = (cmJSONState *)presetName;
  cmStrCat<char_const(&)[18],std::__cxx11::string_const&,char_const(&)[2]>
            (&local_38,(char (*) [18])"Invalid preset: \"",presetName,(char (*) [2])0x115e922);
  cmJSONState::AddError(state,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void INVALID_PRESET_NAMED(const std::string& presetName, cmJSONState* state)
{
  state->AddError(cmStrCat("Invalid preset: \"", presetName, "\""));
}